

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WatcherGeneric.cpp
# Opt level: O2

void __thiscall
efsw::WatcherGeneric::WatcherGeneric
          (WatcherGeneric *this,WatchID id,string *directory,FileWatchListener *fwl,
          FileWatcherImpl *fw,bool recursive)

{
  DirWatcherGeneric *this_00;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)directory);
  Watcher::Watcher(&this->super_Watcher,id,&local_50,fwl,recursive);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Watcher)._vptr_Watcher = (_func_int **)&PTR__WatcherGeneric_0011cc40;
  this->WatcherImpl = fw;
  this->DirWatch = (DirWatcherGeneric *)0x0;
  FileSystem::dirAddSlashAtEnd(&(this->super_Watcher).Directory);
  this_00 = (DirWatcherGeneric *)operator_new(0xc0);
  DirWatcherGeneric::DirWatcherGeneric
            (this_00,(DirWatcherGeneric *)0x0,this,directory,recursive,false);
  this->DirWatch = this_00;
  DirWatcherGeneric::addChilds(this_00,false);
  return;
}

Assistant:

WatcherGeneric::WatcherGeneric( WatchID id, const std::string& directory, FileWatchListener* fwl,
								FileWatcherImpl* fw, bool recursive ) :
	Watcher( id, directory, fwl, recursive ), WatcherImpl( fw ), DirWatch( NULL ) {
	FileSystem::dirAddSlashAtEnd( Directory );

	DirWatch = new DirWatcherGeneric( NULL, this, directory, recursive, false );

	DirWatch->addChilds( false );
}